

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int strarray_copy(strarray *dst,strarray *src)

{
  ulong __size;
  char *__dest;
  size_t block;
  char *ptr;
  strarray *src_local;
  strarray *dst_local;
  
  if ((src->value == (char *)0x0) || (src->length == 0)) {
    memset(dst,0,0x10);
    dst_local._4_4_ = 0;
  }
  else {
    __size = src->length + 0x3f & 0xffffffffffffffc0;
    __dest = (char *)realloc(dst->value,__size);
    if (__dest == (char *)0x0) {
      dst_local._4_4_ = -1;
    }
    else {
      memcpy(__dest,src->value,src->length);
      memset(__dest + src->length,0,__size - src->length);
      dst->length = src->length;
      dst->value = __dest;
      dst_local._4_4_ = 0;
    }
  }
  return dst_local._4_4_;
}

Assistant:

int
strarray_copy(struct strarray *dst, const struct strarray *src) {
  char *ptr;
  size_t block;
  if (src->value == NULL || src->length == 0) {
    memset(dst, 0, sizeof(*dst));
    return 0;
  }

  block = STRARRAY_MEMSIZE(src->length);
  ptr = realloc(dst->value, block);
  if (!ptr) {
    return -1;
  }

  memcpy(ptr, src->value, src->length);
  memset(ptr + src->length, 0, block - src->length);
  dst->length = src->length;
  dst->value = ptr;
  return 0;
}